

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arduino.h
# Opt level: O0

void __thiscall SpyingSerial::clear(SpyingSerial *this)

{
  allocator<char> local_31;
  string local_30 [32];
  SpyingSerial *local_10;
  SpyingSerial *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"",&local_31);
  std::__cxx11::stringstream::str((string *)this);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

void clear() { log_.str(""); }